

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O2

bool __thiscall
ON_PolyCurve::GetNextDiscontinuity
          (ON_PolyCurve *this,continuity c,double t0,double t1,double *t,int *hint,int *dtype,
          double cos_angle_tolerance,double curvature_tolerance)

{
  uint uVar1;
  ON_Object *p;
  ON_Object *p_00;
  double dVar2;
  double dVar3;
  ON_3dVector Km_00;
  ON_3dVector Km_01;
  ON_3dVector Kp_00;
  ON_3dVector Kp_01;
  undefined1 auVar4 [16];
  bool bVar5;
  bool bVar6;
  continuity cVar7;
  uint uVar8;
  int iVar9;
  double *pdVar10;
  ON_ArcCurve *pOVar11;
  ON_ArcCurve *pOVar12;
  double *knot;
  ON_Curve *seg1;
  ON_Object *this_00;
  uint hint_00;
  int iVar13;
  ulong uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double s;
  continuity local_1fc;
  undefined1 local_1f8 [16];
  ulong local_1e8;
  ON_Interval local_1e0;
  ON_3dVector local_1d0;
  undefined1 local_1b8 [16];
  ulong local_1a0;
  ON_3dVector Kp;
  ON_3dVector Km;
  ON_3dVector Tp;
  ON_3dVector Tm;
  ON_3dVector D1p;
  ON_3dVector D1m;
  ON_Interval sdom;
  ON_3dVector D2p;
  ON_3dVector D2m;
  ON_3dPoint Pp;
  ON_3dPoint Pm;
  
  ON_Interval::ON_Interval(&sdom);
  ON_Interval::ON_Interval(&local_1e0);
  uVar1 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count;
  if (dtype != (int *)0x0) {
    *dtype = 0;
  }
  bVar5 = false;
  hint_00 = 0;
  if (t0 != t1 && 0 < (int)uVar1) {
    cVar7 = ON::ParametricContinuity(c);
    if (hint != (int *)0x0) {
      hint_00 = *hint & 0x3fff;
    }
    if ((this->m_t).m_count < 1) {
      pdVar10 = (double *)0x0;
    }
    else {
      pdVar10 = (this->m_t).m_a;
    }
    uVar8 = ON_NurbsSpanIndex(2,uVar1 + 1,pdVar10,t0,((t0 <= t1) - 1) + (uint)(t0 <= t1),hint_00);
    iVar13 = 0;
    if ((hint != (int *)0x0) && (iVar13 = 0, hint_00 == uVar8)) {
      iVar13 = *hint >> 0xe;
    }
    pdVar10 = (this->m_t).m_a;
    dVar18 = pdVar10[(int)uVar8];
    dVar19 = pdVar10[(long)(int)uVar8 + 1];
    dVar17 = (ABS(dVar19 - dVar18) + ABS(dVar19) + ABS(dVar18)) * 1.490116119385e-08;
    local_1fc = c;
    if (dVar18 + dVar17 < dVar19 - dVar17) {
      if (t0 < t1) {
        if ((((t0 < dVar19) && (dVar19 < t1)) && ((int)(uVar8 + 1) < (int)uVar1)) &&
           (ABS(t0 - dVar19) <= dVar17)) {
          knot = (double *)0x0;
          if (0 < (this->m_t).m_count) {
            knot = pdVar10;
          }
          uVar8 = ON_NurbsSpanIndex(2,uVar1 + 1,knot,dVar19,1,hint_00);
          t0 = dVar19;
        }
      }
      else if (((dVar18 < t0) && (t1 < dVar18)) &&
              ((0 < (int)uVar8 && (ABS(t0 - dVar18) <= dVar17)))) {
        t0 = dVar18;
      }
    }
    local_1a0 = (ulong)(((t0 <= t1) - 1) + (uint)(t0 <= t1));
    dVar18 = t0;
    if (t0 <= t1) {
      dVar18 = t1;
    }
    dVar17 = ABS(t1) + ABS(t0);
    dVar19 = (ABS(t0 - t1) + dVar17) * 2.3283064365386963e-10;
    dVar21 = t1;
    if (t0 <= t1) {
      dVar21 = t0;
    }
    dVar22 = dVar21 + dVar19;
    dVar19 = dVar18 - dVar19;
    bVar5 = false;
    do {
      if (uVar1 <= uVar8) goto LAB_0059546e;
      uVar14 = (ulong)uVar8;
      local_1e8 = (ulong)(uVar8 + 1);
      pdVar10 = (this->m_t).m_a;
      if (((pdVar10[local_1e8] <= dVar21) ||
          (pdVar10 = pdVar10 + uVar14, dVar18 < *pdVar10 || dVar18 == *pdVar10)) ||
         (p = (ON_Object *)(this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a[uVar14],
         p == (ON_Object *)0x0)) goto LAB_0059546e;
      (*p->_vptr_ON_Object[0x25])(p);
      pdVar10 = (this->m_t).m_a;
      local_1e0.m_t[1] = dVar17;
      ON_Interval::Set(&sdom,pdVar10[uVar14],pdVar10[local_1e8]);
      dVar17 = ON_Interval::TransformParameterTo(&sdom,&local_1e0,t0);
      local_1f8._8_4_ = extraout_XMM0_Dc;
      local_1f8._0_8_ = dVar17;
      local_1f8._12_4_ = extraout_XMM0_Dd;
      dVar17 = ON_Interval::TransformParameterTo(&sdom,&local_1e0,t1);
      uVar15 = SUB84(dVar17,0);
      uVar16 = (undefined4)((ulong)dVar17 >> 0x20);
      local_1b8._8_4_ = extraout_XMM0_Dc_00;
      local_1b8._0_8_ = dVar17;
      local_1b8._12_4_ = extraout_XMM0_Dd_00;
      iVar9 = (*p->_vptr_ON_Object[0x36])
                        (local_1f8._0_4_,uVar15,cos_angle_tolerance,curvature_tolerance,p,
                         (ulong)cVar7,&s);
      dVar17 = (double)CONCAT44(uVar16,uVar15);
      if ((char)iVar9 != '\0') {
        bVar5 = ON_Interval::operator==(&sdom,&local_1e0);
        dVar17 = s;
        if ((bVar5) ||
           ((dVar2 = ON_Interval::TransformParameterTo(&local_1e0,&sdom,s), dVar22 < dVar2 &&
            (dVar17 = dVar2, dVar2 < dVar19)))) {
LAB_0059539a:
          if (t == (double *)0x0) {
            return true;
          }
          *t = dVar17;
          if (hint == (int *)0x0) {
            return true;
          }
          *hint = iVar13 << 0xe | uVar8;
          return true;
        }
        dVar17 = ON_Interval::Length(&sdom);
        dVar20 = ON_Interval::Length(&local_1e0);
        dVar17 = ABS(dVar17 / dVar20);
        dVar20 = 1.0;
        if ((1.0 <= dVar17) && (dVar20 = dVar17, 1000.0 < dVar17)) {
          dVar20 = 1000.0;
        }
        dVar20 = (ABS((double)local_1f8._0_8_ - (double)local_1b8._0_8_) +
                 ABS((double)local_1b8._0_8_) + ABS((double)local_1f8._0_8_)) *
                 2.3283064365386963e-10 * dVar20;
        dVar17 = (double)local_1b8._0_8_;
        dVar3 = (double)local_1f8._0_8_;
        if (dVar2 <= dVar22) {
          if ((double)local_1f8._0_8_ <= (double)local_1b8._0_8_) {
            dVar3 = (double)local_1f8._0_8_ + dVar20;
          }
          else {
            dVar17 = (double)local_1b8._0_8_ + dVar20;
          }
        }
        uVar15 = SUB84(dVar3,0);
        if (dVar19 <= dVar2) {
          if (dVar3 <= dVar17) {
            dVar17 = dVar17 - dVar20;
          }
          else {
            uVar15 = SUB84(dVar3 - dVar20,0);
          }
        }
        iVar9 = (*p->_vptr_ON_Object[0x36])
                          (uVar15,SUB84(dVar17,0),cos_angle_tolerance,curvature_tolerance,p,
                           (ulong)cVar7,&s);
        if ((((char)iVar9 != '\0') &&
            (dVar17 = ON_Interval::TransformParameterTo(&local_1e0,&sdom,s), dVar21 < dVar17)) &&
           (dVar17 < dVar18)) goto LAB_0059539a;
      }
      uVar8 = uVar8 + (int)local_1a0;
      if ((uVar1 <= uVar8) ||
         (p_00 = (ON_Object *)(this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a[uVar8],
         p_00 == (ON_Object *)0x0)) {
        bVar5 = false;
        goto LAB_0059546e;
      }
      if (t1 < t0) {
        pdVar10 = ON_Interval::operator[](&sdom,0);
        if (*pdVar10 <= t1) goto LAB_005953da;
        pdVar10 = ON_Interval::operator[](&local_1e0,0);
        local_1f8._0_8_ = *pdVar10;
        (*p_00->_vptr_ON_Object[0x25])(p_00);
        iVar9 = 1;
        local_1d0.y = dVar17;
        pdVar10 = ON_Interval::operator[]((ON_Interval *)&local_1d0,1);
        uVar15 = SUB84(*pdVar10,0);
        uVar16 = (undefined4)((ulong)*pdVar10 >> 0x20);
      }
      else {
        pdVar10 = ON_Interval::operator[](&sdom,1);
        if (t1 <= *pdVar10) {
LAB_005953da:
          bVar5 = false;
          goto LAB_0059546e;
        }
        pdVar10 = ON_Interval::operator[](&local_1e0,1);
        local_1f8._0_8_ = *pdVar10;
        (*p_00->_vptr_ON_Object[0x25])(p_00);
        local_1d0.y = dVar17;
        pdVar10 = ON_Interval::operator[]((ON_Interval *)&local_1d0,0);
        uVar15 = SUB84(*pdVar10,0);
        uVar16 = (undefined4)((ulong)*pdVar10 >> 0x20);
        iVar9 = -1;
      }
      auVar4 = local_1b8;
      bVar5 = false;
      if (cVar7 < (Gsmooth_continuous|C0_continuous)) {
        local_1b8._4_4_ = uVar16;
        local_1b8._0_4_ = uVar15;
        local_1b8._8_8_ = auVar4._8_8_;
        if ((0x1028U >> (cVar7 & 0x1f) & 1) != 0) {
          ON_Curve::Ev2Der((ON_Curve *)p,(double)local_1f8._0_8_,&Pm,&D1m,&D2m,iVar9,(int *)0x0);
          ON_Curve::Ev2Der((ON_Curve *)p_00,(double)local_1b8._0_8_,&Pp,&D1p,&D2p,-iVar9,(int *)0x0)
          ;
          if (cVar7 == C2_continuous) {
            ON_3dVector::operator-(&local_1d0,&D1m,&D1p);
            dVar17 = ON_3dVector::MaximumCoordinate(&D1m);
            uVar15 = 0x2c4;
            uVar16 = 0x3e500000;
            bVar5 = ON_3dVector::IsTiny(&local_1d0,dVar17 * 1.490116119385e-08);
            if (bVar5) {
              ON_3dVector::operator-(&local_1d0,&D2m,&D2p);
              dVar17 = ON_3dVector::MaximumCoordinate(&D2m);
              bVar5 = ON_3dVector::IsTiny(&local_1d0,dVar17 * 1.490116119385e-08);
              if (bVar5 || dtype == (int *)0x0) {
                bVar5 = !bVar5;
                dVar17 = (double)CONCAT44(uVar16,uVar15);
                goto LAB_00595382;
              }
              iVar13 = 2;
              goto LAB_0059541f;
            }
            if (dtype != (int *)0x0) {
              iVar13 = 1;
              goto LAB_0059541f;
            }
          }
          else {
            ON_EvCurvature(&D1m,&D2m,&Tm,&Km);
            ON_EvCurvature(&D1p,&D2p,&Tp,&Kp);
            dVar17 = ON_3dVector::operator*(&Tm,&Tp);
            if (cos_angle_tolerance <= dVar17) {
              if (cVar7 == Gsmooth_continuous) {
                Km_00.y = Km.y;
                Km_00.x = Km.x;
                Km_00.z = Km.z;
                Kp_00.y = Kp.y;
                Kp_00.x = Kp.x;
                Kp_00.z = Kp.z;
                bVar5 = ON_IsGsmoothCurvatureContinuous
                                  (Km_00,Kp_00,cos_angle_tolerance,curvature_tolerance);
                if ((!bVar5) ||
                   (((pOVar11 = ON_ArcCurve::Cast(p), pOVar11 != (ON_ArcCurve *)0x0 &&
                     (pOVar12 = ON_ArcCurve::Cast(p_00), pOVar12 != (ON_ArcCurve *)0x0)) &&
                    (bVar5 = ON_ArcToArcTransitionIsNotGsmooth
                                       (&pOVar11->m_arc,&pOVar12->m_arc,cos_angle_tolerance,
                                        curvature_tolerance), bVar5)))) {
LAB_005953e9:
                  iVar13 = 2;
                  if (dtype == (int *)0x0) goto LAB_00595423;
                  goto LAB_0059541f;
                }
                this_00 = p;
                if (t0 <= t1) {
                  this_00 = p_00;
                  p_00 = p;
                }
                bVar5 = ON_Curve::LastSpanIsLinear((ON_Curve *)p_00,1e-08,1e-08);
                uVar15 = 0xe2308c3a;
                uVar16 = 0x3e45798e;
                bVar6 = ON_Curve::FirstSpanIsLinear((ON_Curve *)this_00,1e-08,1e-08);
                bVar5 = bVar6 != bVar5;
                dVar17 = (double)CONCAT44(uVar16,uVar15);
                if ((dtype != (int *)0x0) && (dVar17 = (double)CONCAT44(uVar16,uVar15), bVar5)) {
                  iVar13 = 3;
                  goto LAB_0059541f;
                }
              }
              else {
                Km_01.y = Km.y;
                Km_01.x = Km.x;
                Km_01.z = Km.z;
                Kp_01.y = Kp.y;
                Kp_01.x = Kp.x;
                Kp_01.z = Kp.z;
                dVar17 = curvature_tolerance;
                bVar5 = ON_IsG2CurvatureContinuous
                                  (Km_01,Kp_01,cos_angle_tolerance,curvature_tolerance);
                if (!bVar5) goto LAB_005953e9;
                bVar5 = false;
              }
              goto LAB_00595382;
            }
            if (dtype == (int *)0x0) {
              bVar5 = true;
              break;
            }
            iVar13 = 1;
LAB_0059541f:
            *dtype = iVar13;
          }
LAB_00595423:
          bVar5 = true;
          break;
        }
        if ((0x14U >> (cVar7 & 0x1f) & 1) != 0) {
          ON_Curve::Ev1Der((ON_Curve *)p,(double)local_1f8._0_8_,&Pm,&D1m,iVar9,(int *)0x0);
          ON_Curve::Ev1Der((ON_Curve *)p_00,(double)local_1b8._0_8_,&Pp,&D1p,-iVar9,(int *)0x0);
          if (cVar7 == C1_continuous) {
            ON_3dVector::operator-(&local_1d0,&D1m,&D1p);
            dVar2 = ON_3dVector::MaximumCoordinate(&D1m);
            bVar5 = ON_3dVector::IsTiny(&local_1d0,dVar2 * 1.490116119385e-08);
            bVar5 = !bVar5;
          }
          else {
            Tm.z = D1m.z;
            Tm.x = D1m.x;
            Tm.y = D1m.y;
            Tp.x = D1p.x;
            Tp.y = D1p.y;
            Tp.z = D1p.z;
            ON_3dVector::Unitize(&Tm);
            ON_3dVector::Unitize(&Tp);
            dVar2 = ON_3dVector::operator*(&Tm,&Tp);
            bVar5 = true;
            dVar17 = cos_angle_tolerance;
            if (cos_angle_tolerance <= dVar2) {
              bVar5 = false;
              goto LAB_00595382;
            }
          }
          if ((dtype != (int *)0x0) && (bVar5)) {
            *dtype = 1;
          }
        }
      }
LAB_00595382:
    } while (bVar5 == false);
    if (t0 <= t1) {
      uVar14 = local_1e8;
    }
    if (t != (double *)0x0) {
      *t = (this->m_t).m_a[uVar14 & 0xffffffff];
    }
    if (hint != (int *)0x0) {
      *hint = (int)uVar14;
    }
LAB_0059546e:
    if ((cVar7 != local_1fc) && (!bVar5)) {
      bVar5 = ON_Curve::GetNextDiscontinuity
                        (&this->super_ON_Curve,local_1fc,t0,t1,t,(int *)0x0,dtype,
                         cos_angle_tolerance,curvature_tolerance);
    }
  }
  return bVar5;
}

Assistant:

bool ON_PolyCurve::GetNextDiscontinuity( 
        ON::continuity c,
        double t0,
        double t1,
        double* t,
        int* hint,
        int* dtype,
        double cos_angle_tolerance,
        double curvature_tolerance
        ) const
{
  ON_3dPoint Pm, Pp;
  ON_3dVector D1m, D1p, D2m, D2p, Tm, Tp, Km, Kp;
  double s0, s1, s;
  bool rc = false;
  ON_Interval sdom, cdom;
  const int count = Count();
  int segment_hint=0, curve_hint=0;
  if ( dtype )
    *dtype = 0;
  if ( count > 0 && t0 != t1 ) 
  {
    // 20 March 2003 Dale Lear:
    //     look for parametric discontinuities on the interior.
    //     If we don't find any, then well check for locus 
    //     discontinuities at the appropriate end
    ON::continuity input_c = c;
    c = ON::ParametricContinuity((int)c);

    segment_hint = (hint) ? (*hint & 0x3FFF) : 0;
    int segment_index = ON_NurbsSpanIndex(2,count+1,m_t,t0,(t0>t1)?-1:1,segment_hint);
    curve_hint = ( hint && segment_hint == segment_index ) ? ((*hint)>>14) : 0;


    {
      // 20 March 2003 Dale Lear:
      //     If t0 is very near interior m_t[] value, see if it
      //     should be set to that value.  A bit or two of 
      //     precision sometimes gets lost in proxy
      //     domain to real curve domain conversions on the interior
      //     of a curve domain.
      double segtol = (fabs(m_t[segment_index]) + fabs(m_t[segment_index+1]) + fabs(m_t[segment_index+1]-m_t[segment_index]))*ON_SQRT_EPSILON;
      if ( m_t[segment_index]+segtol < m_t[segment_index+1]-segtol )
      {
        if ( t0 < t1 )
        {
          if ( t0 < m_t[segment_index+1] && t1 > m_t[segment_index+1] && fabs(t0-m_t[segment_index+1]) <= segtol && segment_index+1 < count )
          {
            t0 = m_t[segment_index+1];
            segment_index = ON_NurbsSpanIndex(2,count+1,m_t,t0,1,segment_hint);
          }
        }
        else
        {
          if ( t0 > m_t[segment_index] && t1 < m_t[segment_index] && fabs(t0-m_t[segment_index]) <= segtol && segment_index > 0 )
          {
            t0 = m_t[segment_index];
          }
        }
      }
    }

    double tmin, tmax;
    int segment_index_delta;
    if (t0 > t1)
    {
      segment_index_delta = -1;
      tmin = t1;
      tmax = t0;
    }
    else
    {
      segment_index_delta = 1;
      tmin = t0;
      tmax = t1;
    }

    const ON_Curve* crv;
    for ( /*empty*/; 
              segment_index >= 0 
           && segment_index < count
           && tmin < m_t[segment_index+1] && m_t[segment_index] < tmax; 
          segment_index += segment_index_delta )
    {
      crv = m_segment[segment_index];
      if ( !crv )
        break;
      
      cdom = crv->Domain();
      sdom.Set( m_t[segment_index], m_t[segment_index+1] );
      s0 = sdom.TransformParameterTo(cdom, t0);
      s1 = sdom.TransformParameterTo(cdom, t1);
      rc = crv->GetNextDiscontinuity( c, s0, s1, &s, &curve_hint, dtype, cos_angle_tolerance, curvature_tolerance );
      if ( rc )
      {
        double kink_t;
        if ( sdom == cdom )
        {
          kink_t = s;
        }
        else
        {
          kink_t = cdom.TransformParameterTo(sdom, s);
          double t_tol = (fabs(t0)+fabs(t1)+fabs(t0-t1))*ON_ZERO_TOLERANCE;
          if ( kink_t <= tmin+t_tol || kink_t >= tmax-t_tol)
          {
            // 24 January 2002 Dale Lear -
            // It is possible that lost precision in the 
            // domain conversion is giving us trouble.
            // In particular, if this code is not here,
            // "t0" is right at a kink, and s0 gets bumped
            // down a little bit due to rounding/truncation,
            // we end up finding the kink at "t0" that we were
            // supposed to skip.
            double e = fabs(sdom.Length()/cdom.Length());
            if ( e < 1.0 ) e = 1.0; else if (e > 1000.0) e = 1000.0;
            double s_tol = (fabs(s0)+fabs(s1)+fabs(s0-s1))*ON_ZERO_TOLERANCE*e;
            if ( kink_t <= tmin+t_tol )
            {
              if( s0>s1 )
                s1 = s1 + s_tol;
              else
                s0 = s0 + s_tol;
            }
            if ( kink_t >= tmax-t_tol )
            {
              if ( s0>s1 )
                s0 = s0 - s_tol;
              else
                s1 = s1 - s_tol;
            }
            rc = crv->GetNextDiscontinuity( c, s0, s1, &s, &curve_hint, dtype, cos_angle_tolerance, curvature_tolerance );
            if (rc)
            {
              kink_t = cdom.TransformParameterTo(sdom, s);
              if ( kink_t <= tmin || kink_t >= tmax )
                rc = false;
            }
          }
        }

        if (rc)
        {
          if ( t )
          {
            *t = kink_t;
            if ( hint )
            {
              *hint = segment_index | (curve_hint<<14);
            }
          }
          break;
        }
      }


      // check for discontinuity between curve segments
      int next_segment_index = segment_index+segment_index_delta;
      if ( next_segment_index < 0 || next_segment_index >= count )
      {
        // no more curve segments in search interval
        break;
      }
      const ON_Curve* crv1 = m_segment[next_segment_index];
      if ( !crv1 )
        break;

      if ( t0 > t1 )
      {
        if ( sdom[0] <= t1 ) // this line is correct - search is decreasing towards t1
        {
          // INTERIOR of search interval does not include 
          // start this crv = end of next curve
          break;
        }
      }
      else
      {
        if ( t1 <= sdom[1] )
        {
          // INTERIOR of search interval does not include 
          // end of this crv = start of next curve
          break;
        }
      }

      double crv0_t, crv1_t;
      int crv0_side;
      if ( t0 > t1 )
      {
        // compare start if this curve against end of next curve
        crv0_t = cdom[0];
        crv1_t = crv1->Domain()[1];
        crv0_side = 1;
      }
      else
      {
        // compare end if this curve against start of next curve
        crv0_t = cdom[1];
        crv1_t = crv1->Domain()[0];
        crv0_side = -1;
      }

      switch( c )
      {
      case ON::continuity::C1_continuous:
      case ON::continuity::G1_continuous:
        crv->Ev1Der( crv0_t, Pm, D1m, crv0_side );   // point on this curve
        crv1->Ev1Der( crv1_t, Pp, D1p, -crv0_side ); // corresponding point on next curve
        if ( c == ON::continuity::C1_continuous )
        {
          if ( !(D1m-D1p).IsTiny(D1m.MaximumCoordinate()*ON_SQRT_EPSILON) )
            rc = true;
        }
        else
        {
          Tm = D1m;
          Tp = D1p;
          Tm.Unitize();
          Tp.Unitize();
          if ( Tm*Tp < cos_angle_tolerance )
            rc = true;
        }
        if ( rc && dtype )
          *dtype = 1;
        break;

      case ON::continuity::C2_continuous:
      case ON::continuity::G2_continuous:
      case ON::continuity::Gsmooth_continuous:
        crv->Ev2Der( crv0_t, Pm, D1m, D2m, crv0_side );   // point on this curve
        crv1->Ev2Der( crv1_t, Pp, D1p, D2p, -crv0_side ); // corresponding point on next curve
        if ( c == ON::continuity::C2_continuous )
        {
          if ( !(D1m-D1p).IsTiny(D1m.MaximumCoordinate()*ON_SQRT_EPSILON) ) 
          {
            rc = true;
            if ( dtype )
              *dtype = 1;
          }
          else if ( !(D2m-D2p).IsTiny(D2m.MaximumCoordinate()*ON_SQRT_EPSILON) )
          {
            rc = true;
            if ( dtype )
              *dtype = 2;
          }
        }
        else
        {
          ON_EvCurvature( D1m, D2m, Tm, Km );
          ON_EvCurvature( D1p, D2p, Tp, Kp );
          if ( Tm*Tp < cos_angle_tolerance )
          {
            rc = true;
            if ( dtype )
              *dtype = 1;
          }
          else 
          {
            bool bIsCurvatureContinuous = ( ON::continuity::Gsmooth_continuous == c )
              ? ON_IsGsmoothCurvatureContinuous(Km, Kp, cos_angle_tolerance, curvature_tolerance)
              : ON_IsG2CurvatureContinuous(Km, Kp, cos_angle_tolerance, curvature_tolerance);
            if ( bIsCurvatureContinuous &&  ON::continuity::Gsmooth_continuous == c )
            {
              // This fixex http://dev.mcneel.com/bugtrack/?q=116273
              const ON_ArcCurve* arc0 = ON_ArcCurve::Cast(crv);
              if ( 0 != arc0 )
              {
                const ON_ArcCurve* arc1 = ON_ArcCurve::Cast(crv1);
                if ( 0 != arc1 )
                {
                  // 6 November, 2012 Dale Lear
                  //   Fix bug 116273
                  //   by breaking when adjacent, tangent coplanar arcs
                  //   are visually different.
                  if ( ON_ArcToArcTransitionIsNotGsmooth(arc0->m_arc,arc1->m_arc, cos_angle_tolerance, curvature_tolerance ) )
                    bIsCurvatureContinuous = false;
                }
              }
            }
            if ( !bIsCurvatureContinuous )
            {
              // NOTE:
              //   The test to enter this scope must exactly match
              //   the one used in ON_NurbsCurve::GetNextDiscontinuity().
              rc = true;
              if ( dtype )
                *dtype = 2;
            }
            else if ( ON::continuity::Gsmooth_continuous == c )
            {
              const double is_linear_tolerance = 1.0e-8;  
              const double is_linear_min_length = 1.0e-8;
              const ON_Curve* seg0;
              const ON_Curve* seg1;
              if (crv0_side<0)
              {
                seg0 = crv;
                seg1 = crv1;
              }
              else
              {
                seg0 = crv1;
                seg1 = crv;
              }
              bool b0 = seg0->LastSpanIsLinear(is_linear_min_length,is_linear_tolerance);
              bool b1 = seg1->FirstSpanIsLinear(is_linear_min_length,is_linear_tolerance);
              if ( b0 != b1 )
              {
                rc = true;
                if ( dtype )
                  *dtype = 3;
              }
            }
          }
        }
        break;
      default:
        // intentionally ignoring other ON::continuity enum values
        break;
      }
      if (rc)
      {
        int tindex = (t0>t1)?segment_index:(segment_index+1); 
        if ( t )
          *t = m_t[tindex];
        if ( hint )
        {
          *hint = tindex;
        }
        break;
      }
    }

    if ( !rc && input_c != c )
    {
      // 20 March 2003 Dale Lear
      //   See if we need to do a locus check at an end
      rc = ON_Curve::GetNextDiscontinuity( input_c, 
                        t0, t1, t, nullptr, 
                        dtype, 
                        cos_angle_tolerance, curvature_tolerance );
    }
  }
  return rc;
}